

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O1

string * tinyusdz::unwrap(string *__return_storage_ptr__,string *str,string *l,string *r)

{
  pointer pcVar1;
  ulong __n;
  int iVar2;
  long lVar3;
  long *local_40;
  ulong local_38;
  long local_30 [2];
  
  if (str->_M_string_length < r->_M_string_length) {
LAB_0029b2e2:
    local_40 = local_30;
    pcVar1 = (str->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + str->_M_string_length);
  }
  else {
    lVar3 = ::std::__cxx11::string::find
                      ((char *)str,(ulong)(r->_M_dataplus)._M_p,
                       str->_M_string_length - r->_M_string_length);
    if (lVar3 == -1) goto LAB_0029b2e2;
    ::std::__cxx11::string::substr((ulong)&local_40,(ulong)str);
  }
  __n = l->_M_string_length;
  if (local_38 < __n) {
LAB_0029b326:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_40,local_38 + (long)local_40);
  }
  else {
    if (__n != 0) {
      iVar2 = bcmp((l->_M_dataplus)._M_p,local_40,__n);
      if (iVar2 != 0) goto LAB_0029b326;
    }
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_40);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string unwrap(const std::string &str, const std::string &l,
                          const std::string &r) {
  return removePrefix(removeSuffix(str, r), l);
}